

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

UCalendar * ucal_clone_63(UCalendar *cal,UErrorCode *status)

{
  UBool UVar1;
  Calendar *res;
  UErrorCode *status_local;
  UCalendar *cal_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    cal_local = (UCalendar *)(**(code **)((long)*cal + 0x18))();
    if (cal_local == (UCalendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      cal_local = (UCalendar *)0x0;
    }
  }
  else {
    cal_local = (UCalendar *)0x0;
  }
  return cal_local;
}

Assistant:

U_CAPI UCalendar* U_EXPORT2 
ucal_clone(const UCalendar* cal,
           UErrorCode*      status)
{
  if(U_FAILURE(*status)) return 0;
  
  Calendar* res = ((Calendar*)cal)->clone();

  if(res == 0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return 0;
  }

  return (UCalendar*) res;
}